

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen-io.h
# Opt level: O1

istringstream * Eigen::operator>>(istringstream *iss,Vector *inst)

{
  int iVar1;
  istream *piVar2;
  ExceptionSignal *pEVar3;
  long *plVar4;
  long lVar5;
  char _ch;
  uint _size;
  double _dbl_val;
  format fmt;
  char local_155;
  uint local_154;
  string_type local_150;
  put_holder<char,_std::char_traits<char>_> local_130;
  double local_118;
  undefined1 local_110 [128];
  void *local_90;
  undefined8 uStack_88;
  long local_80 [4];
  locale local_60 [8];
  char *local_58;
  bool local_50;
  bool local_40;
  locale local_38 [8];
  
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             "Failed to enter %s as vector. Reenter as [N](val1,val2,val3,...,valN)");
  std::__cxx11::stringbuf::str();
  local_130.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_130.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_130.arg = &local_150;
  boost::io::detail::
  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             &local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  piVar2 = std::operator>>((istream *)iss,&local_155);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (local_155 != '[')) {
    pEVar3 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_130.arg = (void *)CONCAT44(local_130.arg._4_4_,100);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_150,local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (pEVar3,(ErrorCodeEnum *)&local_130,(string *)&local_150);
    __cxa_throw(pEVar3,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  piVar2 = std::istream::_M_extract<unsigned_int>((uint *)iss);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) ||
     (((byte)iss[*(long *)(*(long *)iss + -0x18) + 0x20] & 5) != 0)) {
    pEVar3 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_130.arg = (void *)CONCAT44(local_130.arg._4_4_,100);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_150,local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (pEVar3,(ErrorCodeEnum *)&local_130,(string *)&local_150);
    __cxa_throw(pEVar3,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)inst,(ulong)local_154,(ulong)local_154,1);
  piVar2 = std::operator>>((istream *)iss,&local_155);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (local_155 != ']')) {
    pEVar3 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_130.arg = (void *)CONCAT44(local_130.arg._4_4_,100);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_150,local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (pEVar3,(ErrorCodeEnum *)&local_130,(string *)&local_150);
    __cxa_throw(pEVar3,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  piVar2 = std::operator>>((istream *)iss,&local_155);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (local_155 != '(')) {
    pEVar3 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_130.arg = (void *)CONCAT44(local_130.arg._4_4_,100);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_150,local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (pEVar3,(ErrorCodeEnum *)&local_130,(string *)&local_150);
    __cxa_throw(pEVar3,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  if (local_154 != 0) {
    lVar5 = 0;
    do {
      std::istream::_M_extract<double>((double *)iss);
      iVar1 = std::istream::peek();
      if (iVar1 == 0x2c) {
LAB_001270c8:
        std::istream::ignore();
      }
      else {
        iVar1 = std::istream::peek();
        if (iVar1 == 0x20) goto LAB_001270c8;
      }
      if ((inst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          lVar5) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      (inst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[lVar5]
           = local_118;
      lVar5 = lVar5 + 1;
    } while ((uint)lVar5 < local_154);
  }
  piVar2 = std::operator>>((istream *)iss,&local_155);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (local_155 != ')')) {
    pEVar3 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_130.arg = (void *)CONCAT44(local_130.arg._4_4_,100);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_150,local_110);
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (pEVar3,(ErrorCodeEnum *)&local_130,(string *)&local_150);
    __cxa_throw(pEVar3,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  if (local_40 == true) {
    std::locale::~locale(local_38);
    local_40 = false;
  }
  local_110._120_8_ = &PTR__basic_altstringbuf_00134c48;
  if (local_50 == true) {
    plVar4 = local_80 + 3;
    if (local_80[2] == 0) {
      plVar4 = local_80;
    }
    operator_delete(local_90,*plVar4 - (long)local_90);
  }
  local_50 = false;
  local_58 = (char *)0x0;
  local_90 = (void *)0x0;
  uStack_88 = 0;
  local_80[0] = 0;
  local_80[1] = 0;
  local_80[2] = 0;
  local_80[3] = 0;
  local_110._120_8_ = __assert_fail;
  std::locale::~locale(local_60);
  if ((undefined1 *)local_110._80_8_ != local_110 + 0x60) {
    operator_delete((void *)local_110._80_8_,local_110._96_8_ + 1);
  }
  if ((_Bit_type *)local_110._24_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_110._24_8_,local_110._56_8_ - local_110._24_8_);
    local_110._24_8_ = (_Bit_type *)0x0;
    local_110._32_4_ = 0;
    local_110._40_8_ = (_Bit_type *)0x0;
    local_110._48_4_ = 0;
    local_110._56_8_ = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  return iss;
}

Assistant:

inline std::istringstream &operator>>(std::istringstream &iss,
                                      dynamicgraph::Vector &inst) {
  unsigned int _size;
  double _dbl_val;
  char _ch;
  boost::format fmt(
      "Failed to enter %s as vector."
      " Reenter as [N](val1,val2,val3,...,valN)");
  fmt % iss.str();
  if (iss >> _ch && _ch != '[') {
    throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
  } else {
    if (iss >> _size && !iss.fail()) {
      inst.resize(_size);
    } else
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    if (iss >> _ch && _ch != ']')
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    else {
      if (iss >> _ch && _ch != '(')
        throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
      else {
        for (unsigned int i = 0; i < _size; i++) {
          iss >> _dbl_val;
          if (iss.peek() == ',' || iss.peek() == ' ') iss.ignore();
          inst(i) = _dbl_val;
        }
        if (iss >> _ch && _ch != ')')
          throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
      }
    }
  }
  return iss;
}